

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_ellswift_setup(void *arg)

{
  long lVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  undefined8 uStack_30;
  
  lVar1 = (long)arg + 0x4008;
  puVar2 = (uchar *)((long)arg + 0x4038);
  puVar2[0] = 'H';
  puVar2[1] = 'Q';
  puVar2[2] = '\x1e';
  puVar2[3] = 0xd4;
  puVar2[4] = '\x16';
  puVar2[5] = 0xfd;
  puVar2[6] = 'B';
  puVar2[7] = 0x85;
  puVar2 = (uchar *)((long)arg + 0x4040);
  puVar2[0] = 'b';
  puVar2[1] = 0xc9;
  puVar2[2] = '\x02';
  puVar2[3] = 0xf9;
  puVar2[4] = 0x89;
  puVar2[5] = 0x84;
  puVar2[6] = 0xff;
  puVar2[7] = 0xdc;
  puVar2 = (uchar *)((long)arg + 0x4028);
  puVar2[0] = 0xb0;
  puVar2[1] = ',';
  puVar2[2] = 'F';
  puVar2[3] = 0xd8;
  puVar2[4] = 0xba;
  puVar2[5] = 0xca;
  puVar2[6] = '&';
  puVar2[7] = 'O';
  puVar2 = (uchar *)((long)arg + 0x4030);
  puVar2[0] = 0x8f;
  puVar2[1] = 0x8c;
  puVar2[2] = 0xd4;
  puVar2[3] = 0xdd;
  puVar2[4] = '-';
  puVar2[5] = '\x04';
  puVar2[6] = 0xbe;
  puVar2[7] = '0';
  puVar2 = (uchar *)((long)arg + 0x4018);
  puVar2[0] = '\n';
  puVar2[1] = 'd';
  puVar2[2] = 0xca;
  puVar2[3] = '2';
  puVar2[4] = 0x9e;
  puVar2[5] = 0xc6;
  puVar2[6] = ' ';
  puVar2[7] = 'y';
  puVar2 = (uchar *)((long)arg + 0x4020);
  puVar2[0] = '\x03';
  puVar2[1] = 0xf3;
  puVar2[2] = 0xd0;
  puVar2[3] = 'F';
  puVar2[4] = 'z';
  puVar2[5] = '\x0f';
  puVar2[6] = 0xd2;
  puVar2[7] = '!';
  puVar2 = (uchar *)((long)arg + 0x4008);
  puVar2[0] = 'x';
  puVar2[1] = '\x1f';
  puVar2[2] = 0xb7;
  puVar2[3] = 0xd4;
  builtin_memcpy((uchar *)((long)arg + 0x400c),"g\x7f\bh",4);
  puVar2 = (uchar *)((long)arg + 0x4010);
  puVar2[0] = 0xdb;
  puVar2[1] = 0xe3;
  puVar2[2] = '\x1d';
  puVar2[3] = '\x7f';
  puVar2 = (uchar *)((long)arg + 0x4014);
  puVar2[0] = '\x1b';
  puVar2[1] = 0xb0;
  puVar2[2] = 0xf6;
  puVar2[3] = 0x9e;
  lVar6 = 0;
  do {
    if (lVar6 == 0x100) {
      iVar3 = secp256k1_ellswift_encode
                        (*arg,lVar1,(long)arg + 0x3fc8,bench_ellswift_setup::init + 0x10);
      if (iVar3 != 0) {
        return;
      }
      pcVar5 = 
      "test condition failed: secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16)"
      ;
      uStack_30 = 0x26;
LAB_001027e7:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/bench_impl.h"
              ,uStack_30,pcVar5);
      abort();
    }
    iVar3 = secp256k1_ellswift_decode(*arg,(long)arg + lVar6 * 0x40 + 8,lVar1);
    if (iVar3 == 0) {
      pcVar5 = 
      "test condition failed: secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64)";
      uStack_30 = 0x21;
      goto LAB_001027e7;
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      *(char *)(lVar1 + lVar4) = *(char *)(lVar1 + lVar4) + '\x01';
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static void bench_ellswift_setup(void *arg) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;
    static const unsigned char init[64] = {
        0x78, 0x1f, 0xb7, 0xd4, 0x67, 0x7f, 0x08, 0x68,
        0xdb, 0xe3, 0x1d, 0x7f, 0x1b, 0xb0, 0xf6, 0x9e,
        0x0a, 0x64, 0xca, 0x32, 0x9e, 0xc6, 0x20, 0x79,
        0x03, 0xf3, 0xd0, 0x46, 0x7a, 0x0f, 0xd2, 0x21,
        0xb0, 0x2c, 0x46, 0xd8, 0xba, 0xca, 0x26, 0x4f,
        0x8f, 0x8c, 0xd4, 0xdd, 0x2d, 0x04, 0xbe, 0x30,
        0x48, 0x51, 0x1e, 0xd4, 0x16, 0xfd, 0x42, 0x85,
        0x62, 0xc9, 0x02, 0xf9, 0x89, 0x84, 0xff, 0xdc
    };
    memcpy(data->rnd64, init, 64);
    for (i = 0; i < 256; ++i) {
        int j;
        CHECK(secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64));
        for (j = 0; j < 64; ++j) {
            data->rnd64[j] += 1;
        }
    }
    CHECK(secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16));
}